

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx *dctx,void *dict,size_t dictSize)

{
  uint uVar1;
  size_t code;
  long in_RDX;
  size_t in_RSI;
  void *in_RDI;
  size_t err_code;
  ZSTD_DCtx *in_stack_fffffffffffffff8;
  
  code = ZSTD_decompressBegin((ZSTD_DCtx *)0x2f65fd);
  uVar1 = ERR_isError(code);
  if (uVar1 == 0) {
    if ((in_RSI != 0) && (in_RDX != 0)) {
      ZSTD_decompress_insertDictionary(in_stack_fffffffffffffff8,in_RDI,in_RSI);
      uVar1 = ZSTD_isError(0x2f6648);
      if (uVar1 != 0) {
        return 0xffffffffffffffe2;
      }
    }
    code = 0;
  }
  return code;
}

Assistant:

size_t ZSTD_decompressBegin_usingDict(ZSTD_DCtx* dctx, const void* dict, size_t dictSize)
{
    FORWARD_IF_ERROR( ZSTD_decompressBegin(dctx) , "");
    if (dict && dictSize)
        RETURN_ERROR_IF(
            ZSTD_isError(ZSTD_decompress_insertDictionary(dctx, dict, dictSize)),
            dictionary_corrupted, "");
    return 0;
}